

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void __thiscall
kj::(anonymous_namespace)::expectResImpl<kj::Array<char32_t>,char32_t>
          (_anonymous_namespace_ *this,EncodingResult<kj::Array<char32_t>_> *result,
          ArrayPtr<const_char32_t> expected,bool errors)

{
  uint i_00;
  char32_t *pcVar1;
  char32_t *pcVar2;
  unsigned_long i;
  CappedArray<char,_9UL> local_60;
  CappedArray<char,_9UL> local_48;
  
  pcVar1 = expected.ptr;
  if ((int)expected.size_ == 0) {
    if (((byte)this[0x18] & _::Debug::minSeverity < 3) == 1) {
      _::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x2d,ERROR,"\"failed: expected \" \"!result.hadErrors\"",
                 (char (*) [35])"failed: expected !result.hadErrors");
    }
  }
  else if (this[0x18] == (_anonymous_namespace_)0x0 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x2b,ERROR,"\"failed: expected \" \"result.hadErrors\"",
               (char (*) [34])"failed: expected result.hadErrors");
  }
  pcVar2 = *(char32_t **)(this + 8);
  if ((pcVar2 != pcVar1) && (_::Debug::minSeverity < 3)) {
    local_60.currentSize = (size_t)pcVar1;
    local_48.currentSize = (size_t)pcVar2;
    _::Debug::log<char_const(&)[50],unsigned_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x30,ERROR,
               "\"failed: expected \" \"result.size() == expected.size()\", result.size(), expected.size()"
               ,(char (*) [50])"failed: expected result.size() == expected.size()",
               &local_48.currentSize,&local_60.currentSize);
    pcVar2 = *(char32_t **)(this + 8);
  }
  if (pcVar2 < pcVar1) {
    pcVar1 = pcVar2;
  }
  for (pcVar2 = (char32_t *)0x0; pcVar1 != pcVar2; pcVar2 = (char32_t *)((long)pcVar2 + 1)) {
    i_00 = *(uint *)(*(long *)this + (long)pcVar2 * 4);
    if ((i_00 != *(uint *)((long)&(result->super_Array<char32_t>).ptr + (long)pcVar2 * 4)) &&
       (_::Debug::minSeverity < 3)) {
      i = (unsigned_long)pcVar2;
      hex(&local_48,i_00);
      hex(&local_60,*(uint *)((long)&(result->super_Array<char32_t>).ptr + i * 4));
      _::Debug::
      log<char_const(&)[42],unsigned_long&,kj::CappedArray<char,9ul>,kj::CappedArray<char,9ul>>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x32,ERROR,
                 "\"failed: expected \" \"result[i] == expected[i]\", i, hex(result[i]), hex(expected[i])"
                 ,(char (*) [42])"failed: expected result[i] == expected[i]",&i,&local_48,&local_60)
      ;
    }
  }
  return;
}

Assistant:

void expectResImpl(EncodingResult<T> result,
                   ArrayPtr<const U> expected,
                   bool errors = false) {
  if (errors) {
    KJ_EXPECT(result.hadErrors);
  } else {
    KJ_EXPECT(!result.hadErrors);
  }

  KJ_EXPECT(result.size() == expected.size(), result.size(), expected.size());
  for (auto i: kj::zeroTo(kj::min(result.size(), expected.size()))) {
    KJ_EXPECT(result[i] == expected[i], i, hex(result[i]), hex(expected[i]));
  }
}